

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

void __thiscall GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::NewBucket(Geobucket<4UL> *this)

{
  iterator __position;
  long lVar1;
  unsigned_long local_18;
  
  lVar1 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_buckets).
                super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
  resize(&this->_buckets,(lVar1 >> 5) + 1);
  local_18 = *(long *)((long)(this->_maxsizes).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + (lVar1 >> 2) + -8) << 2;
  __position._M_current =
       (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->_maxsizes,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void NewBucket()
		{
			size_t size = (size_t)_buckets.size();
			_buckets.resize(size + 1);
			_buckets[size].SetOrder(_buckets[size - 1].GetOrder());
			_maxsizes.push_back(_d * _maxsizes[size - 1]);
		}